

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

TrackDescriptor * __thiscall
perfetto::ProcessTrack::Serialize(TrackDescriptor *__return_storage_ptr__,ProcessTrack *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint64_t uVar3;
  _Head_base<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_false> _Var4;
  bool bVar5;
  ulong uVar6;
  TrackDescriptor *desc;
  string cmdline;
  StringSplitter splitter;
  allocator<char> local_d9;
  string local_d8;
  StringSplitter local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  protos::gen::TrackDescriptor::TrackDescriptor(__return_storage_ptr__);
  __return_storage_ptr__->uuid_ = (this->super_Track).uuid;
  uVar6 = (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w;
  uVar3 = (this->super_Track).parent_uuid;
  if (uVar3 == 0) {
    uVar6 = uVar6 | 2;
  }
  else {
    __return_storage_ptr__->parent_uuid_ = uVar3;
    uVar6 = uVar6 | 0x22;
  }
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar6 | 8;
  _Var4._M_head_impl =
       (__return_storage_ptr__->process_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ProcessDescriptor,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_false>._M_head_impl;
  (_Var4._M_head_impl)->pid_ = this->pid;
  *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 2;
  paVar1 = &local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_b8.str_.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_b8.str_._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/proc/self/cmdline","");
  bVar5 = base::ReadFile(&local_b8.str_,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.str_._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.str_._M_dataplus._M_p,local_b8.str_.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,local_d8._M_dataplus._M_p,&local_d9);
    ::std::__cxx11::string::_M_assign((string *)&(_Var4._M_head_impl)->process_name_);
    *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         *(byte *)&((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> | 0x40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.str_._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8.str_._M_dataplus._M_p,local_b8.str_.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar1) {
      local_50.field_2._8_8_ = local_d8.field_2._8_8_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    }
    local_50.field_2._M_allocated_capacity._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
    local_50.field_2._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
    local_50._M_string_length = local_d8._M_string_length;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    base::StringSplitter::StringSplitter(&local_b8,&local_50,'\0');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar5 = base::StringSplitter::Next(&local_b8);
    if (bVar5) {
      do {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,local_b8.cur_,local_b8.cur_ + local_b8.cur_size_);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(_Var4._M_head_impl)->cmdline_,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        bVar5 = base::StringSplitter::Next(&local_b8);
      } while (bVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.str_._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8.str_._M_dataplus._M_p,local_b8.str_.field_2._M_allocated_capacity + 1
                     );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor ProcessTrack::Serialize() const {
  auto desc = Track::Serialize();
  auto pd = desc.mutable_process();
  pd->set_pid(static_cast<int32_t>(pid));
#if PERFETTO_BUILDFLAG(PERFETTO_OS_LINUX) || \
    PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID)
  std::string cmdline;
  if (base::ReadFile("/proc/self/cmdline", &cmdline)) {
    // Since cmdline is a zero-terminated list of arguments, this ends up
    // writing just the first element, i.e., the process name, into the process
    // name field.
    pd->set_process_name(cmdline.c_str());
    base::StringSplitter splitter(std::move(cmdline), '\0');
    while (splitter.Next()) {
      pd->add_cmdline(
          std::string(splitter.cur_token(), splitter.cur_token_size()));
    }
  }
  // TODO(skyostil): Record command line on Windows and Mac.
#endif
  return desc;
}